

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<128U,_16U,_buffer_layout_bfs>::operator()
          (fill<128U,_16U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_128UL> *buffer_count_00;
  int iVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  unsigned_long *puVar7;
  uchar **from0;
  fill<128U,_32U,_buffer_layout_bfs> local_6c;
  fill<128U,_33U,_buffer_layout_bfs> local_6b;
  fill<128U,_33U,_buffer_layout_bfs> local_6a;
  fill<128U,_32U,_buffer_layout_bfs> local_69;
  uchar **local_68;
  array<Stream,_128UL> *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  array<unsigned_long,_128UL> *local_48;
  size_t local_40;
  long local_38;
  
  puVar7 = buffer_count->_M_elems + 0x20;
  local_58 = buffer_count->_M_elems + 0x21;
  local_68 = buffer + 0x210;
  sVar5 = 0;
  lVar6 = 0;
  local_60 = streams;
  local_50 = puVar7;
  local_48 = buffer_count;
  while ((buffer_count_00 = local_48, *puVar7 != 0 ||
         (fill<128U,_32U,_buffer_layout_bfs>::operator()(&local_69,local_60,buffer,local_48),
         buffer_count_00->_M_elems[0x20] != 0))) {
    if ((*local_58 == 0) &&
       (fill<128U,_33U,_buffer_layout_bfs>::operator()(&local_6a,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x21] == 0)) {
      __n = -lVar6;
      lVar6 = -sVar5;
      goto LAB_00140f96;
    }
    puVar4 = local_58;
    uVar1 = *puVar7;
    __s1 = buffer[0x5ca8 - uVar1];
    local_40 = sVar5;
    local_38 = lVar6;
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *local_58;
    __s2 = buffer[0x5cb0 - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    sVar5 = local_40;
    puVar7 = local_50;
    if (iVar3 < 1) {
      puVar4 = local_50;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_40 + 0x210] = __s2;
    *puVar4 = uVar2 - 1;
    check_input(local_68,local_40);
    lVar6 = local_38 + -8;
    sVar5 = sVar5 + 1;
    if (sVar5 == 0x5a9) {
      local_48->_M_elems[0x10] = 0x5a9;
      return;
    }
  }
  __n = -lVar6;
  lVar6 = -sVar5;
  do {
    if ((buffer_count_00->_M_elems[0x21] == 0) &&
       (fill<128U,_33U,_buffer_layout_bfs>::operator()(&local_6b,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x21] == 0)) goto LAB_00141003;
    uVar1 = buffer_count_00->_M_elems[0x21];
    *(uchar **)((long)buffer + __n + 0x1080) = buffer[0x5cb0 - uVar1];
    buffer_count_00->_M_elems[0x21] = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x2d48);
  goto LAB_00140feb;
LAB_00141003:
  from0 = (uchar **)((long)buffer + (0x3dc8 - __n));
  sVar5 = -lVar6;
  memmove(buffer + lVar6 + 0x7b9,local_68,__n);
  buffer_count_00->_M_elems[0x10] = sVar5;
  goto LAB_00141039;
  while( true ) {
    uVar1 = *puVar7;
    *(uchar **)((long)buffer + __n + 0x1080) = buffer[0x5ca8 - uVar1];
    *puVar7 = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
    if (__n == 0x2d48) break;
LAB_00140f96:
    if ((*puVar7 == 0) &&
       (fill<128U,_32U,_buffer_layout_bfs>::operator()(&local_6c,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x20] == 0)) goto LAB_00141003;
  }
LAB_00140feb:
  buffer_count_00->_M_elems[0x10] = 0x5a9;
  sVar5 = 0x5a9;
  from0 = local_68;
LAB_00141039:
  check_input(from0,sVar5);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}